

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O2

void bsp_check_exit(void)

{
  int fini;
  int init;
  
  if (s_expect_abort_msg == (char *)0x0) {
    _fini = 0;
    MPI_Initialized(&init);
    MPI_Finalized(&fini);
    if (((init != 0) && (fini == 0)) && (s_aborting == '\0')) {
      if (s_spmd != (Spmd *)0x0) {
        fwrite("bsp_end: was not called before end of program\n",0x2e,1,_stderr);
        MPI_Abort(&ompi_mpi_comm_world,1);
      }
      MPI_Abort(&ompi_mpi_comm_world,0);
    }
    return;
  }
  fprintf(_stderr,"An error should have been detected \'%s\'\n");
  abort();
}

Assistant:

static void bsp_check_exit(void) 
{
    if ( s_expect_abort_msg ) {
        std::fprintf(stderr, "An error should have been detected '%s'\n",
                s_expect_abort_msg );
        std::abort();
    }

    int init = 0, fini = 0;
    MPI_Initialized(&init);
    MPI_Finalized(&fini);
    if (init && !fini && !s_aborting ) {
        // calling mpi_finalize() in atexit handler, might
        // deadlock some MPI implementations (Microsoft, IBM)
        if (s_spmd) {
            std::fprintf( stderr, "bsp_end: was not called before end of program\n");
            MPI_Abort( MPI_COMM_WORLD, EXIT_FAILURE );
        }
        MPI_Abort( MPI_COMM_WORLD, EXIT_SUCCESS );
    }
}